

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O3

uint32_t phf_f<std::__cxx11::string>
                   (uint32_t d,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> k,
                   uint32_t seed)

{
  uint uVar1;
  uint *puVar2;
  uint in_ECX;
  uint uVar3;
  uint uVar4;
  long in_RDX;
  undefined4 in_register_00000034;
  uint *local_40;
  long local_38;
  uint local_30 [4];
  
  uVar1 = (d * -0x3361d2af >> 0x11 | d * 0x16a88000) * 0x1b873593 ^ in_ECX;
  uVar1 = uVar1 << 0xd | uVar1 >> 0x13;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,CONCAT44(in_register_00000034,seed),
             in_RDX + CONCAT44(in_register_00000034,seed));
  puVar2 = local_40;
  do {
    uVar1 = uVar1 * 5 + 0xe6546b64;
    uVar4 = 0;
    uVar3 = 0;
    switch(local_38) {
    case 3:
      uVar3 = (uint)*(byte *)((long)puVar2 + 2) << 8;
    case 2:
      uVar4 = uVar3 | (uint)*(byte *)((long)puVar2 + 1) << 0x10;
    case 1:
      uVar1 = (((uint)(byte)*puVar2 << 0x18 | uVar4) * -0x3361d2af >> 0x11 | uVar4 * 0x16a88000) *
              0x1b873593 ^ uVar1;
      uVar1 = (uVar1 << 0xd | uVar1 >> 0x13) * 5 + 0xe6546b64;
    case 0:
      if (local_40 != local_30) {
        operator_delete(local_40);
      }
      uVar1 = (uVar1 >> 0x10 ^ uVar1) * -0x7a143595;
      uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51cb;
      return uVar1 >> 0x10 ^ uVar1;
    default:
      uVar3 = *puVar2;
      uVar4 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8;
      uVar1 = ((uVar4 | uVar3 << 0x18) * -0x3361d2af >> 0x11 | uVar4 * 0x16a88000) * 0x1b873593 ^
              uVar1;
      uVar1 = uVar1 << 0xd | uVar1 >> 0x13;
      puVar2 = puVar2 + 1;
      local_38 = local_38 + -4;
    }
  } while( true );
}

Assistant:

static inline uint32_t phf_f(uint32_t d, T k, uint32_t seed) {
	uint32_t h1 = seed;

	h1 = phf_round32(d, h1);
	h1 = phf_round32(k, h1);

	return phf_mix32(h1);
}